

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ImFontConfig *pIVar4;
  ImFont **ppIVar5;
  long lVar6;
  long lVar7;
  
  pIVar4 = (this->ConfigData).Data;
  iVar2 = (this->ConfigData).Size;
  for (lVar7 = 0; (long)iVar2 * 0x90 - lVar7 != 0; lVar7 = lVar7 + 0x90) {
    if ((*(void **)(pIVar4->Name + lVar7 + -0x5a) != (void *)0x0) &&
       (pIVar4->Name[lVar7 + -0x4e] == '\x01')) {
      ImGui::MemFree(*(void **)(pIVar4->Name + lVar7 + -0x5a));
      pcVar1 = pIVar4->Name + lVar7 + -0x5a;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
  }
  ppIVar5 = (this->Fonts).Data;
  pIVar4 = (this->ConfigData).Data;
  iVar2 = (this->Fonts).Size;
  iVar3 = (this->ConfigData).Size;
  for (lVar7 = 0; (long)iVar2 * 8 != lVar7; lVar7 = lVar7 + 8) {
    lVar6 = *(long *)((long)ppIVar5 + lVar7);
    if ((pIVar4 <= *(ImFontConfig **)(lVar6 + 0x48)) &&
       (*(ImFontConfig **)(lVar6 + 0x48) < pIVar4 + iVar3)) {
      *(undefined8 *)(lVar6 + 0x48) = 0;
      *(undefined2 *)(lVar6 + 0x50) = 0;
    }
  }
  ImVector<ImFontConfig>::clear(&this->ConfigData);
  ImVector<ImFontAtlasCustomRect>::clear(&this->CustomRects);
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (ImFontConfig& font_cfg : ConfigData)
        if (font_cfg.FontData && font_cfg.FontDataOwnedByAtlas)
        {
            IM_FREE(font_cfg.FontData);
            font_cfg.FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (ImFont* font : Fonts)
        if (font->ConfigData >= ConfigData.Data && font->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            font->ConfigData = NULL;
            font->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}